

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O1

void Gia_ManSimRelAssignInputs
               (Gia_Man_t *p,int nWords,Vec_Wrd_t *vSims,int nWordsIn,Vec_Wrd_t *vSimsIn)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  
  if (vSims->nSize != p->nObjs * nWords) {
    __assert_fail("Vec_WrdSize(vSims) == nWords * Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                  ,0x2ed,
                  "void Gia_ManSimRelAssignInputs(Gia_Man_t *, int, Vec_Wrd_t *, int, Vec_Wrd_t *)")
    ;
  }
  if (vSimsIn->nSize == p->vCis->nSize * nWordsIn) {
    pVVar2 = p->vCis;
    if (0 < pVVar2->nSize) {
      lVar3 = (long)nWordsIn;
      lVar4 = 0;
      do {
        iVar1 = pVVar2->pArray[lVar4];
        if ((iVar1 < 0) || (p->nObjs <= iVar1)) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (iVar1 == 0) {
          return;
        }
        if (0 < (int)((long)nWords / (long)nWordsIn)) {
          lVar7 = lVar4 * lVar3;
          lVar5 = (long)(iVar1 * nWords);
          uVar6 = (long)nWords / (long)nWordsIn & 0xffffffff;
          do {
            if ((((lVar5 < 0) || ((long)vSims->nSize <= (lVar5 + lVar3) - lVar3)) || (lVar7 < 0)) ||
               (vSimsIn->nSize <= lVar7)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                            ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
            }
            uVar6 = uVar6 - 1;
            memcpy(vSims->pArray + lVar5,vSimsIn->pArray + lVar7,lVar3 * 8);
            lVar5 = lVar5 + lVar3;
          } while (uVar6 != 0);
        }
        lVar4 = lVar4 + 1;
        pVVar2 = p->vCis;
      } while (lVar4 < pVVar2->nSize);
    }
    return;
  }
  __assert_fail("Vec_WrdSize(vSimsIn) == nWordsIn * Gia_ManCiNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                ,0x2ee,
                "void Gia_ManSimRelAssignInputs(Gia_Man_t *, int, Vec_Wrd_t *, int, Vec_Wrd_t *)");
}

Assistant:

void Gia_ManSimRelAssignInputs( Gia_Man_t * p, int nWords, Vec_Wrd_t * vSims, int nWordsIn, Vec_Wrd_t * vSimsIn )
{
    int i, m, Id, nMints = nWords / nWordsIn;
    assert( Vec_WrdSize(vSims)   == nWords   * Gia_ManObjNum(p) );
    assert( Vec_WrdSize(vSimsIn) == nWordsIn * Gia_ManCiNum(p) );
    Gia_ManForEachCiId( p, Id, i )
        for ( m = 0; m < nMints; m++ )
            memcpy( Vec_WrdEntryP(vSims, Id * nWords + nWordsIn * m), 
                    Vec_WrdEntryP(vSimsIn, i * nWordsIn), sizeof(word) * nWordsIn );
}